

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::addLocalInfo
          (CoreBroker *this,BasicHandleInfo *handleInfo,ActionMessage *message)

{
  bool bVar1;
  pointer ppVar2;
  long in_RDX;
  long in_RSI;
  iterator res;
  unordered_map<helics::GlobalFederateId,_helics::LocalFederateId,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
  local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<helics::GlobalFederateId,_helics::LocalFederateId,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x5f5402);
  local_28._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<helics::GlobalFederateId,_helics::LocalFederateId,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = CLI::std::__detail::operator==(&local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = CLI::std::__detail::
             _Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false,_false>
                           *)0x5f543e);
    *(BaseType *)(local_10 + 8) = (ppVar2->second).fid;
  }
  *(undefined2 *)(local_10 + 0xe) = *(undefined2 *)(local_18 + 0x1a);
  return;
}

Assistant:

void CoreBroker::addLocalInfo(BasicHandleInfo& handleInfo, const ActionMessage& message)
{
    auto res = global_id_translation.find(message.source_id);
    if (res != global_id_translation.end()) {
        handleInfo.local_fed_id = res->second;
    }
    handleInfo.flags = message.flags;
}